

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void * rw::malloc_managed(size_t sz,uint32 hint)

{
  void *pvVar1;
  MemoryBlock *mem;
  uint8 *data;
  void *origPtr;
  uint32 hint_local;
  size_t sz_local;
  
  if (sz == 0) {
    sz_local = 0;
  }
  else {
    pvVar1 = malloc(sz + 0x3f);
    if (pvVar1 == (void *)0x0) {
      sz_local = 0;
    }
    else {
      totalMemoryAllocated = sz + totalMemoryAllocated;
      sz_local = (long)pvVar1 + 0x3fU & 0xfffffffffffffff0;
      *(size_t *)(sz_local - 0x30) = sz;
      *(uint32 *)(sz_local - 0x28) = hint;
      *(void **)(sz_local - 0x20) = pvVar1;
      *(undefined8 *)(sz_local - 0x18) = allocLocation;
      LinkList::add((LinkList *)&allocations,(LLLink *)(sz_local - 0x10));
    }
  }
  return (void *)sz_local;
}

Assistant:

void*
malloc_managed(size_t sz, uint32 hint)
{
	void *origPtr;
	uint8 *data;
	MemoryBlock *mem;

	if(sz == 0) return nil;
	origPtr = malloc(sz + sizeof(MemoryBlock) + 15);
	if(origPtr == nil)
		return nil;
	totalMemoryAllocated += sz;
	data = (uint8*)origPtr;
	data += sizeof(MemoryBlock);
	data = (uint8*)ALIGN16((uintptr)data);
	mem = (MemoryBlock*)(data-sizeof(MemoryBlock));

	mem->sz = sz;
	mem->hint = hint;
	mem->origPtr = origPtr;
	mem->codeline = allocLocation;
	allocations.add(&mem->inAllocList);

	return data;
}